

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::wait<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  scoped_lock<asio::detail::posix_mutex> *lock_local;
  posix_event *this_local;
  
  bVar1 = scoped_lock<asio::detail::posix_mutex>::locked(lock);
  if (bVar1) {
    while ((this->state_ & 1) == 0) {
      this->state_ = this->state_ + 2;
      __mutex = (pthread_mutex_t *)scoped_lock<asio::detail::posix_mutex>::mutex(lock);
      pthread_cond_wait((pthread_cond_t *)this,__mutex);
      this->state_ = this->state_ - 2;
    }
    return;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/efairbanks[P]TidaLink/link/cmake_include/../modules/asio-standalone/asio/include/asio/detail/posix_event.hpp"
                ,0x65,
                "void asio::detail::posix_event::wait(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
               );
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }